

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

void on_connect(uv_connect_t *req,int status)

{
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  
  if (status == 0) {
    do_write((uv_stream_t *)&client,on_write_close_immediately);
    return;
  }
  on_connect_cold_1();
  *extraout_RDX = on_alloc::slab;
  extraout_RDX[1] = 0x10000;
  return;
}

Assistant:

static void on_connect(uv_connect_t* req, int status) {
  struct sockaddr sockname, peername;
  int r, namelen;

  ASSERT_OK(status);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname((uv_tcp_t*) req->handle, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "127.0.0.1", 0, "connected socket");
  getsocknamecount_tcp++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername((uv_tcp_t*) req->handle, &peername, &namelen);
  ASSERT_OK(r);
  check_sockname(&peername, "127.0.0.1", server_port, "connected socket peer");
  getpeernamecount++;

  uv_close((uv_handle_t*)&tcp, NULL);
}